

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t b_update(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ushort uVar1;
  ion_bpp_err_t iVar2;
  int iVar3;
  ion_bpp_node_t **ppiVar4;
  ion_bpp_address_t iVar5;
  ion_bpp_buffer_t *pbuf;
  int iVar6;
  ion_bpp_h_node_t *h;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_key_t *local_70;
  ion_bpp_buffer_t *local_68;
  ion_bpp_external_address_t local_60;
  ion_bpp_buffer_t *local_58 [5];
  
  pbuf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  ppiVar4 = (ion_bpp_node_t **)((long)handle + 0x38);
  uVar1 = **(ushort **)((long)handle + 0x38);
  local_60 = rec;
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(uVar1 >> 1)) {
    memcpy(*(void **)((long)handle + 0x98),*(ushort **)((long)handle + 0x38),
           (long)*(int *)((long)handle + 0x10) * 3);
    **(ushort **)((long)handle + 0x98) =
         (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
         **(ushort **)((long)handle + 0x38) & 1;
    **(ushort **)((long)handle + 0x38) = **(ushort **)((long)handle + 0x38) & 1;
    iVar2 = scatter(handle,pbuf,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,local_58)
    ;
    if (iVar2 != bErrOk) {
      return iVar2;
    }
    uVar1 = *(ushort *)*ppiVar4;
  }
  iVar6 = 0;
  if ((uVar1 & 1) == 0) {
    iVar6 = 0;
    do {
      iVar3 = search(handle,pbuf,key,local_60,&local_70,MODE_MATCH);
      if (iVar3 < 0) {
        iVar5 = *(ion_bpp_address_t *)(local_70 + -8);
      }
      else {
        iVar5 = *(ion_bpp_address_t *)(local_70 + (long)*(int *)((long)handle + 8) + 8);
      }
      iVar2 = readDisk(handle,iVar5,&local_68);
      if (iVar2 != bErrOk) {
        return iVar2;
      }
      if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)local_68->p >> 1)) {
        iVar2 = gather(handle,(ion_bpp_buffer_t *)*ppiVar4,&local_70,local_58);
        if (iVar2 != bErrOk) {
          return iVar2;
        }
        iVar2 = scatter(handle,pbuf,local_70,3,local_58);
        if (iVar2 != bErrOk) {
          return iVar2;
        }
        iVar3 = search(handle,pbuf,key,local_60,&local_70,MODE_MATCH);
        if (iVar3 < 0) {
          iVar5 = *(ion_bpp_address_t *)(local_70 + -8);
        }
        else {
          iVar5 = *(ion_bpp_address_t *)(local_70 + (long)*(int *)((long)handle + 8) + 8);
        }
        iVar2 = readDisk(handle,iVar5,&local_68);
        if (iVar2 != bErrOk) {
          return iVar2;
        }
      }
      ppiVar4 = &local_68->p;
      iVar6 = iVar6 + 1;
      pbuf = local_68;
    } while ((undefined1  [40])((undefined1  [40])*local_68->p & (undefined1  [40])0x1) ==
             (undefined1  [40])0x0);
  }
  if (maxHeight < iVar6) {
    maxHeight = iVar6;
  }
  iVar2 = bErrKeyNotFound;
  iVar6 = search(handle,pbuf,key,local_60,&local_70,MODE_MATCH);
  if ((iVar6 != -1) && (iVar6 != 1)) {
    *(ion_bpp_external_address_t *)(local_70 + *(int *)((long)handle + 8)) = local_60;
    iVar2 = bErrOk;
  }
  return iVar2;
}

Assistant:

ion_bpp_err_t
b_update(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;	/* match key */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root = &h->root;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to update point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */
					return bErrKeyNotFound;
					break;

				case ION_CC_EQ:	/* key = mkey */
					break;

				case ION_CC_GT:	/* key > mkey */
					return bErrKeyNotFound;
					break;
			}

			/* update key */
			rec(mkey) = rec;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}